

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O2

Read<int> __thiscall Omega_h::Mesh::sync_array<int>(Mesh *this,Int ent_dim,Read<int> *a,Int width)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  Read<int> RVar2;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer local_19a;
  allocator local_199;
  Write<int> local_198;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Dist local_148;
  Dist local_b8;
  
  std::__cxx11::string::string
            ((string *)&local_168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.cpp"
             ,&local_199);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
                 &local_168,":");
  std::__cxx11::to_string(&local_188,0x249);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
                 &local_188);
  begin_code("sync_array",
             (char *)local_b8.parent_comm_.
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  bVar1 = could_be_shared((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
  if (bVar1) {
    ask_dist(&local_148,(Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
    Dist::invert(&local_b8,&local_148);
    Write<int>::Write(&local_198,(Write<int> *)CONCAT44(in_register_0000000c,width));
    Dist::exch<int>((Dist *)this,(Read<int> *)&local_b8,(Int)&local_198);
    Write<int>::~Write(&local_198);
    Dist::~Dist(&local_b8);
    Dist::~Dist(&local_148);
  }
  else {
    Write<int>::Write((Write<int> *)this,(Write<int> *)CONCAT44(in_register_0000000c,width));
  }
  ScopedTimer::~ScopedTimer(&local_19a);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<T> Mesh::sync_array(Int ent_dim, Read<T> a, Int width) {
  OMEGA_H_TIME_FUNCTION;
  if (!could_be_shared(ent_dim)) return a;
  return ask_dist(ent_dim).invert().exch(a, width);
}